

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool wildcard_match(char *wildcard,char *target)

{
  uchar uVar1;
  uchar uVar2;
  bool bVar3;
  _Bool _Var4;
  size_t sVar5;
  size_t sVar6;
  
  if ((*wildcard == '*') && (wildcard[1] == '\0')) {
    return true;
  }
  do {
    uVar1 = *target;
    while( true ) {
      if (uVar1 == '\0') {
        do {
          uVar1 = *wildcard;
          wildcard = (char *)((uchar *)wildcard + 1);
        } while (uVar1 == '*');
        return uVar1 == '\0';
      }
      uVar2 = *wildcard;
      bVar3 = uVar2 != '\0';
      if (uVar2 == '\0') {
        return bVar3;
      }
      sVar5 = get_step_filechar((uchar *)wildcard);
      sVar6 = get_step_filechar((uchar *)target);
      if (uVar2 != '*') break;
      if (((uchar *)wildcard)[sVar5] == '\0') {
        return bVar3;
      }
      _Var4 = wildcard_match_rec(wildcard,(char *)((uchar *)target + sVar6));
      wildcard = (char *)((uchar *)wildcard + sVar5);
      if (_Var4) {
        return bVar3;
      }
    }
    if ((uVar2 != '?') && (uVar2 != uVar1)) {
      return false;
    }
    wildcard = (char *)((uchar *)wildcard + sVar5);
    target = (char *)((uchar *)target + sVar6);
  } while( true );
}

Assistant:

bool wildcard_match(const char *wildcard, const char *target)
{
#if (defined(_WIN32) && !defined(__CYGWIN__))
	if (strcmp(wildcard, "*.*") == 0)
	{
		return true;
	}
#endif
	if (strcmp(wildcard, "*") == 0)
	{
		return true;
	}
	else
	{
		return wildcard_match_rec(wildcard, target);
	}
}